

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxFlopFunctionCall::Resolve(FxFlopFunctionCall *this,FCompileContext *ctx)

{
  FxExpression *pFVar1;
  PInt *pPVar2;
  PFloat *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  FxFloatCast *this_00;
  FxFlopFunctionCall *pFVar5;
  FScriptPosition *other;
  FString FVar6;
  FxExpression **ppFVar7;
  FString local_18;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count == 1) {
      iVar4 = (*(*(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array)->
                _vptr_FxExpression[2])();
      *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array =
           (FxExpression *)CONCAT44(extraout_var,iVar4);
      pFVar1 = *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
      if (pFVar1 != (FxExpression *)0x0) {
        iVar4 = (*(pFVar1->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])();
        if ((char)iVar4 != '\0') {
          iVar4 = (*(*(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array)->
                    _vptr_FxExpression[3])();
          if ((char)iVar4 != '\0') {
            pFVar1 = *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
            pPVar2 = (PInt *)pFVar1[1]._vptr_FxExpression;
            other = &pFVar1[1].ScriptPosition;
            if (pPVar2 == (PInt *)TypeString) {
              FString::AttachToOther(&local_18,&other->FileName);
            }
            else {
              local_18.Chars = (other->FileName).Chars;
            }
            FVar6.Chars = local_18.Chars;
            if ((pPVar2->field_0x6b != '\x01') &&
               (FVar6.Chars = (char *)0x0, pPVar2->field_0x6b == '\0')) {
              if (pPVar2 == TypeUInt32) {
                FVar6.Chars = (char *)(double)((ulong)local_18.Chars & 0xffffffff);
              }
              else {
                FVar6.Chars = (char *)(double)(int)local_18.Chars;
              }
            }
            if (pPVar2 == (PInt *)TypeString) {
              FString::~FString(&local_18);
            }
            ppFVar7 = (FxExpression **)(*FxFlops[this->Index].Evaluate)((double)FVar6.Chars);
            pFVar5 = (FxFlopFunctionCall *)FMemArena::Alloc(&FxAlloc,0x38);
            (pFVar5->super_FxExpression)._vptr_FxExpression =
                 (_func_int **)&PTR__FxExpression_00711370;
            FScriptPosition::FScriptPosition
                      (&(pFVar5->super_FxExpression).ScriptPosition,
                       &(this->super_FxExpression).ScriptPosition);
            (pFVar5->super_FxExpression).ValueType = (PType *)0x0;
            (pFVar5->super_FxExpression).isresolved = false;
            (pFVar5->super_FxExpression).NeedResult = true;
            (pFVar5->super_FxExpression).ExprType = EFX_Constant;
            (pFVar5->super_FxExpression)._vptr_FxExpression =
                 (_func_int **)&PTR__FxConstant_007113e8;
            *(PInt **)&pFVar5->Index = TypeSInt32;
            *(undefined4 *)&(pFVar5->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array = 0
            ;
            pPVar3 = TypeFloat64;
            *(PFloat **)&pFVar5->Index = TypeFloat64;
            (pFVar5->super_FxExpression).ValueType = (PType *)pPVar3;
            (pFVar5->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array = ppFVar7;
            (pFVar5->super_FxExpression).isresolved = true;
            (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
            return &pFVar5->super_FxExpression;
          }
          if ((*(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array)->ValueType->
              RegType == '\0') {
            this_00 = (FxFloatCast *)FMemArena::Alloc(&FxAlloc,0x30);
            FxFloatCast::FxFloatCast
                      (this_00,*(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array);
            *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array =
                 (FxExpression *)this_00;
          }
          (this->super_FxExpression).ValueType = (PType *)TypeFloat64;
          return &this->super_FxExpression;
        }
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,
                   "numeric value expected for parameter");
      }
    }
    else {
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"%s only has one parameter",
                 FName::NameData.NameArray[(int)FxFlops[this->Index].Name].Text);
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxFlopFunctionCall *)0x0;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxFlopFunctionCall::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();

	if (ArgList.Size() != 1)
	{
		ScriptPosition.Message(MSG_ERROR, "%s only has one parameter", FName(FxFlops[Index].Name).GetChars());
		delete this;
		return nullptr;
	}

	ArgList[0] = ArgList[0]->Resolve(ctx);
	if (ArgList[0] == nullptr)
	{
		delete this;
		return nullptr;
	}

	if (!ArgList[0]->IsNumeric())
	{
		ScriptPosition.Message(MSG_ERROR, "numeric value expected for parameter");
		delete this;
		return nullptr;
	}
	if (ArgList[0]->isConstant())
	{
		double v = static_cast<FxConstant *>(ArgList[0])->GetValue().GetFloat();
		v = FxFlops[Index].Evaluate(v);
		FxExpression *x = new FxConstant(v, ScriptPosition);
		delete this;
		return x;
	}
	if (ArgList[0]->ValueType->GetRegType() == REGT_INT)
	{
		ArgList[0] = new FxFloatCast(ArgList[0]);
	}
	ValueType = TypeFloat64;
	return this;
}